

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

short kj::anon_unknown_55::parseInteger<short>(StringPtr *s)

{
  short sVar1;
  short sVar2;
  longlong lVar3;
  longlong max;
  longlong min;
  StringPtr *s_local;
  
  sVar1 = MinValue_::operator_cast_to_short((MinValue_ *)&minValue);
  sVar2 = MaxValue_::operator_cast_to_short((MaxValue_ *)&maxValue);
  lVar3 = parseSigned(s,(long)sVar1,(long)sVar2);
  return (short)lVar3;
}

Assistant:

T parseInteger(const StringPtr& s) {
  if (static_cast<T>(minValue) < 0) {
    long long min = static_cast<T>(minValue);
    long long max = static_cast<T>(maxValue);
    return static_cast<T>(parseSigned(s, min, max));
  } else {
    unsigned long long max = static_cast<T>(maxValue);
    return static_cast<T>(parseUnsigned(s, max));
  }
}